

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O1

void __thiscall
glslang::TDefaultGlslIoResolver::TDefaultGlslIoResolver
          (TDefaultGlslIoResolver *this,TIntermediate *intermediate)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_TDefaultIoResolverBase).super_TIoMapResolver._vptr_TIoMapResolver =
       (_func_int **)&PTR__TDefaultIoResolverBase_00b0dcb0;
  (this->super_TDefaultIoResolverBase).slots._M_h._M_buckets =
       &(this->super_TDefaultIoResolverBase).slots._M_h._M_single_bucket;
  (this->super_TDefaultIoResolverBase).slots._M_h._M_bucket_count = 1;
  (this->super_TDefaultIoResolverBase).slots._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_TDefaultIoResolverBase).slots._M_h._M_element_count = 0;
  (this->super_TDefaultIoResolverBase).slots._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_TDefaultIoResolverBase).slots._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_TDefaultIoResolverBase).slots._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_TDefaultIoResolverBase).hasError = false;
  (this->super_TDefaultIoResolverBase).referenceIntermediate = intermediate;
  (this->super_TDefaultIoResolverBase).nextUniformLocation = intermediate->uniformLocationBase;
  (this->super_TDefaultIoResolverBase).stageIntermediates[0] = (TIntermediate *)0x0;
  (this->super_TDefaultIoResolverBase).stageIntermediates[1] = (TIntermediate *)0x0;
  (this->super_TDefaultIoResolverBase).stageIntermediates[2] = (TIntermediate *)0x0;
  (this->super_TDefaultIoResolverBase).stageIntermediates[3] = (TIntermediate *)0x0;
  (this->super_TDefaultIoResolverBase).stageIntermediates[4] = (TIntermediate *)0x0;
  (this->super_TDefaultIoResolverBase).stageIntermediates[5] = (TIntermediate *)0x0;
  (this->super_TDefaultIoResolverBase).stageIntermediates[6] = (TIntermediate *)0x0;
  (this->super_TDefaultIoResolverBase).stageIntermediates[7] = (TIntermediate *)0x0;
  (this->super_TDefaultIoResolverBase).stageIntermediates[8] = (TIntermediate *)0x0;
  (this->super_TDefaultIoResolverBase).stageIntermediates[9] = (TIntermediate *)0x0;
  (this->super_TDefaultIoResolverBase).stageIntermediates[10] = (TIntermediate *)0x0;
  (this->super_TDefaultIoResolverBase).stageIntermediates[0xb] = (TIntermediate *)0x0;
  (this->super_TDefaultIoResolverBase).stageIntermediates[0xc] = (TIntermediate *)0x0;
  (this->super_TDefaultIoResolverBase).stageIntermediates[0xd] = (TIntermediate *)0x0;
  (this->super_TDefaultIoResolverBase).nextInputLocation = 0;
  (this->super_TDefaultIoResolverBase).nextOutputLocation = 0;
  (this->super_TDefaultIoResolverBase).stageMask[0] = false;
  (this->super_TDefaultIoResolverBase).stageMask[1] = false;
  (this->super_TDefaultIoResolverBase).stageMask[2] = false;
  (this->super_TDefaultIoResolverBase).stageMask[3] = false;
  (this->super_TDefaultIoResolverBase).stageMask[4] = false;
  (this->super_TDefaultIoResolverBase).stageMask[5] = false;
  (this->super_TDefaultIoResolverBase).stageMask[6] = false;
  (this->super_TDefaultIoResolverBase).stageMask[7] = false;
  (this->super_TDefaultIoResolverBase).stageMask[7] = false;
  (this->super_TDefaultIoResolverBase).stageMask[8] = false;
  (this->super_TDefaultIoResolverBase).stageMask[9] = false;
  (this->super_TDefaultIoResolverBase).stageMask[10] = false;
  (this->super_TDefaultIoResolverBase).stageMask[0xb] = false;
  (this->super_TDefaultIoResolverBase).stageMask[0xc] = false;
  (this->super_TDefaultIoResolverBase).stageMask[0xd] = false;
  (this->super_TDefaultIoResolverBase).stageMask[0xe] = false;
  (this->super_TDefaultIoResolverBase).stageIntermediates[intermediate->language] = intermediate;
  (this->super_TDefaultIoResolverBase).super_TIoMapResolver._vptr_TIoMapResolver =
       (_func_int **)&PTR__TDefaultGlslIoResolver_00b0dd70;
  this->preStage = EShLangCount;
  this->currentStage = EShLangCount;
  p_Var1 = &(this->resourceSlotMap)._M_t._M_impl.super__Rb_tree_header;
  (this->resourceSlotMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->resourceSlotMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->resourceSlotMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->resourceSlotMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->resourceSlotMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->storageSlotMap)._M_t._M_impl.super__Rb_tree_header;
  (this->storageSlotMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->storageSlotMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->storageSlotMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->storageSlotMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->storageSlotMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

TDefaultIoResolverBase::TDefaultIoResolverBase(const TIntermediate& intermediate)
    : referenceIntermediate(intermediate)
    , nextUniformLocation(intermediate.getUniformLocationBase())
    , nextInputLocation(0)
    , nextOutputLocation(0)
{
    memset(stageMask, false, sizeof(bool) * (EShLangCount + 1));
    memset(stageIntermediates, 0, sizeof(TIntermediate*) * (EShLangCount));
    stageIntermediates[intermediate.getStage()] = &intermediate;
}